

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
           *kernel)

{
  long start;
  float *pfVar1;
  float fVar2;
  PointerType pfVar3;
  ulong end;
  PointerType pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Index index;
  ulong end_00;
  
  pfVar3 = (kernel->m_dstExpr->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
           .m_data;
  end = (kernel->m_dstExpr->
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        ).
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
        .m_rows.m_value;
  end_00 = end;
  if ((((ulong)pfVar3 & 3) == 0) &&
     (end_00 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 3), (long)end <= (long)end_00))
  {
    end_00 = end;
  }
  start = end_00 + ((long)(end - end_00) / 4) * 4;
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>,Eigen::internal::mul_assign_op<float,float>,0>>
            (kernel,0,end_00);
  for (; (long)end_00 < start; end_00 = end_00 + 4) {
    pfVar4 = (kernel->m_dst->
             super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
             ).
             super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
             .m_data;
    fVar2 = (kernel->m_src->m_functor).m_other;
    pfVar1 = pfVar4 + end_00;
    fVar5 = pfVar1[1];
    fVar6 = pfVar1[2];
    fVar7 = pfVar1[3];
    pfVar4 = pfVar4 + end_00;
    *pfVar4 = fVar2 * *pfVar1;
    pfVar4[1] = fVar2 * fVar5;
    pfVar4[2] = fVar2 * fVar6;
    pfVar4[3] = fVar2 * fVar7;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>,Eigen::internal::mul_assign_op<float,float>,0>>
            (kernel,start,end);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }